

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O1

Error * ot::commissioner::tlv::GetTlvSet
                  (Error *__return_storage_ptr__,TlvSet *aTlvSet,ByteArray *aBuf,Scope aScope)

{
  pointer pcVar1;
  Tlv *pTVar2;
  char *pcVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *aBytes;
  int iVar6;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *from;
  type atVar7 [2];
  format_args args;
  string_view fmt;
  TlvPtr tlv;
  writer write;
  size_t offset;
  Tlv *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined1 local_d8 [32];
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  TlvSet *local_80;
  string local_78;
  size_t local_58;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  local_e0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_e0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_58 = 0;
  local_80 = aTlvSet;
  do {
    if ((ulong)((long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= local_58) {
      return __return_storage_ptr__;
    }
    Tlv::Deserialize((Tlv *)&local_f0,__return_storage_ptr__,&local_58,aBuf,aScope);
    pTVar2 = local_f0;
    iVar6 = 6;
    if (__return_storage_ptr__->mCode == kNone) {
      if (local_f0 == (Tlv *)0x0) {
        abort();
      }
      bVar4 = Tlv::IsValid(local_f0);
      if (bVar4) {
        local_b8.types_[0]._0_1_ = pTVar2->mType;
        pmVar5 = std::
                 map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                 ::operator[](local_80,(key_type *)&local_b8);
        (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = local_f0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar5->
                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,&local_e8);
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"coap","");
        local_b8.types_[0] = uint_type;
        local_b8.types_[1] = string_type;
        from = "dropping invalid/unknown TLV(type={}, value={})";
        local_b8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "dropping invalid/unknown TLV(type={}, value={})";
        local_b8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2f;
        local_b8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_b8.context_.super_basic_format_parse_context<char>._20_4_ = 2;
        local_d8._0_8_ = &local_b8;
        local_b8.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        local_b8.parse_funcs_[1] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        aBytes = extraout_RDX;
        local_b8.context_.types_ = (type *)local_d8._0_8_;
        do {
          if (from == "") break;
          to = from;
          if (*from == '{') {
LAB_0018f092:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_d8,from,to);
            from = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char,std::__cxx11::string>&>
                             (to,"",&local_b8);
            bVar4 = true;
            aBytes = extraout_RDX_00;
          }
          else {
            to = from + 1;
            bVar4 = to != "";
            if (bVar4) {
              if (*to != '{') {
                pcVar3 = from + 2;
                do {
                  to = pcVar3;
                  bVar4 = to != "";
                  if (to == "") goto LAB_0018f08e;
                  pcVar3 = to + 1;
                } while (*to != '{');
              }
              bVar4 = true;
            }
LAB_0018f08e:
            if (bVar4) goto LAB_0018f092;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_d8,from,"");
            bVar4 = false;
            aBytes = extraout_RDX_01;
          }
        } while (bVar4);
        atVar7._1_7_ = 0;
        atVar7[0]._0_1_ = local_f0->mType;
        utils::Hex_abi_cxx11_((string *)local_d8,(utils *)&local_f0->mValue,aBytes);
        local_b8.context_.super_basic_format_parse_context<char>.format_str_.size_ = local_d8._0_8_;
        local_b8.context_.super_basic_format_parse_context<char>._16_8_ = local_d8._8_8_;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_b8;
        fmt.size_ = 0xd2;
        fmt.data_ = (char *)0x2f;
        local_b8.types_ = atVar7;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_50,(v10 *)"dropping invalid/unknown TLV(type={}, value={})",fmt,args);
        Log(kWarn,&local_78,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_d8._0_8_ !=
            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      iVar6 = 0;
    }
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
    if (iVar6 != 0) {
      if ((iVar6 != 6) &&
         (pcVar1 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar1 != local_e0)) {
        operator_delete(pcVar1);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Error GetTlvSet(TlvSet &aTlvSet, const ByteArray &aBuf, Scope aScope)
{
    Error  error;
    size_t offset = 0;

    while (offset < aBuf.size())
    {
        auto tlv = tlv::Tlv::Deserialize(error, offset, aBuf, aScope);
        SuccessOrExit(error);
        VerifyOrDie(tlv != nullptr);

        if (tlv->IsValid())
        {
            aTlvSet[tlv->GetType()] = tlv;
        }
        else
        {
            // Drop invalid TLVs
            LOG_WARN(LOG_REGION_COAP, "dropping invalid/unknown TLV(type={}, value={})",
                     utils::to_underlying(tlv->GetType()), utils::Hex(tlv->GetValue()));
        }
    }

exit:
    return error;
}